

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuScreenResolutionLine::GetString
          (FOptionMenuScreenResolutionLine *this,int i,char *s,int len)

{
  char *__src;
  int len_local;
  char *s_local;
  int i_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  if ((i < 0x30000) || (0x30002 < i)) {
    this_local._7_1_ = false;
  }
  else {
    __src = FString::operator_cast_to_char_(this->mResTexts + (i + -0x30000));
    strncpy(s,__src,(long)(len + -1));
    s[len + -1] = '\0';
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GetString(int i, char *s, int len)
	{
		if (i >= SRL_INDEX && i <= SRL_INDEX+2) 
		{
			strncpy(s, mResTexts[i-SRL_INDEX], len-1);
			s[len-1] = 0;
			return true;
		}
		return false;
	}